

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  *in_RDI;
  
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f4f9a8;
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>::
  ~shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
               *)0x55506d);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::~tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
            *)0x55507b);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::~tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
            *)0x555089);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  ::~tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
            *)0x555097);
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  ::~ParamIteratorInterface(in_RDI);
  return;
}

Assistant:

~IteratorImpl() override {}